

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImGuiTabItem *pIVar1;
  ImVec2 *pIVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  uint3 uVar6;
  ImGuiContext *pIVar7;
  ImGuiWindow *pIVar8;
  char *pcVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  ImS8 IVar13;
  ImU32 id;
  undefined4 uVar14;
  ImU32 col;
  ImGuiID close_button_id;
  ulong uVar15;
  ImGuiTabItem *pIVar16;
  size_t sVar17;
  char *pcVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  ImGuiCol idx;
  ulong uVar22;
  ImGuiTabItem *pIVar23;
  int iVar24;
  bool bVar25;
  uint uVar26;
  float fVar27;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar28;
  float fVar29;
  bool text_clipped;
  bool just_closed;
  uint local_bc;
  ImRect bb;
  bool held;
  float local_8c;
  ImDrawList *local_88;
  ImGuiWindow *local_80;
  bool hovered;
  undefined7 uStack_77;
  float fStack_74;
  bool *local_70;
  char *local_68;
  uint local_60;
  int local_5c;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImGuiTabItem *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar7 = GImGui;
  local_80 = GImGui->CurrentWindow;
  if (local_80->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return false;
  }
  local_70 = (bool *)0x0;
  uVar21 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_70 = p_open;
    uVar21 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar21 = flags;
  }
  IVar28 = TabItemCalcSize(label,local_70 != (bool *)0x0);
  fVar29 = IVar28.x;
  if (id == 0) {
LAB_0016769c:
    p_open = (bool *)0x0;
  }
  else {
    uVar15 = (ulong)(tab_bar->Tabs).Size;
    bVar25 = 0 < (long)uVar15;
    if (0 < (long)uVar15) {
      p_open = (bool *)(tab_bar->Tabs).Data;
      bVar25 = true;
      if (((ImGuiTabItem *)p_open)->ID != id) {
        pIVar16 = (ImGuiTabItem *)((long)p_open + (uVar15 - 1) * 0x24);
        uVar10 = 1;
        pIVar23 = (ImGuiTabItem *)p_open;
        do {
          uVar22 = uVar10;
          p_open = (bool *)pIVar16;
          if (uVar15 == uVar22) break;
          p_open = (bool *)(pIVar23 + 1);
          pIVar1 = pIVar23 + 1;
          uVar10 = uVar22 + 1;
          pIVar23 = (ImGuiTabItem *)p_open;
        } while (pIVar1->ID != id);
        bVar25 = uVar22 < uVar15;
      }
    }
    if (!bVar25) goto LAB_0016769c;
  }
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_4_ = IVar28.x;
  local_58._4_4_ = IVar28.y;
  local_58._12_4_ = extraout_XMM0_Dd;
  local_38 = (ImGuiTabItem *)p_open;
  local_68 = label;
  if ((ImGuiTabItem *)p_open == (ImGuiTabItem *)0x0) {
    iVar20 = (tab_bar->Tabs).Size;
    iVar4 = (tab_bar->Tabs).Capacity;
    if (iVar20 == iVar4) {
      iVar20 = iVar20 + 1;
      if (iVar4 == 0) {
        iVar19 = 8;
      }
      else {
        iVar19 = iVar4 / 2 + iVar4;
      }
      if (iVar20 < iVar19) {
        iVar20 = iVar19;
      }
      if (iVar4 < iVar20) {
        pIVar16 = (ImGuiTabItem *)MemAlloc((long)iVar20 * 0x24);
        pIVar23 = (tab_bar->Tabs).Data;
        if (pIVar23 != (ImGuiTabItem *)0x0) {
          memcpy(pIVar16,pIVar23,(long)(tab_bar->Tabs).Size * 0x24);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = pIVar16;
        (tab_bar->Tabs).Capacity = iVar20;
        fVar29 = (float)local_58._0_4_;
      }
    }
    pIVar23 = (tab_bar->Tabs).Data;
    iVar20 = (tab_bar->Tabs).Size;
    pIVar23[iVar20].ID = 0;
    pIVar23[iVar20].Flags = 0;
    pIVar23[iVar20].LastFrameVisible = -1;
    pIVar23[iVar20].LastFrameSelected = -1;
    pIVar23[iVar20].Offset = 0.0;
    pIVar23[iVar20].Width = 0.0;
    pIVar23[iVar20].ContentWidth = 0.0;
    pIVar23 = pIVar23 + iVar20;
    pIVar23->NameOffset = -1;
    pIVar23->BeginOrder = -1;
    pIVar23->IndexDuringLayout = -1;
    pIVar23->WantClose = false;
    pIVar23->field_0x23 = 0;
    iVar20 = (tab_bar->Tabs).Size;
    (tab_bar->Tabs).Size = iVar20 + 1;
    pIVar23 = (tab_bar->Tabs).Data;
    local_38 = pIVar23 + iVar20;
    local_38->ID = id;
    pIVar23[iVar20].Width = fVar29;
    tab_bar->TabsAddedNew = true;
  }
  pcVar9 = local_68;
  tab_bar->LastTabItemIdx =
       (short)((uint)((int)local_38 - *(int *)&(tab_bar->Tabs).Data) >> 2) * -0x71c7;
  local_38->ContentWidth = fVar29;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  local_38->BeginOrder = sVar3;
  uVar5 = tab_bar->Flags;
  iVar19 = tab_bar->PrevFrameVisible + 1;
  iVar20 = pIVar7->FrameCount;
  iVar24 = local_38->LastFrameVisible + 1;
  local_38->LastFrameVisible = iVar20;
  local_38->Flags = uVar21;
  iVar4 = (tab_bar->TabsNames).Buf.Size;
  sVar3 = (short)iVar4 + -1;
  if (iVar4 == 0) {
    sVar3 = 0;
  }
  local_38->NameOffset = sVar3;
  local_bc = uVar21;
  sVar17 = strlen(local_68);
  uVar21 = local_bc;
  ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar9,pcVar9 + sVar17 + 1);
  pIVar8 = local_80;
  if (((iVar24 < iVar20) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar19 < iVar20) {
      if ((uVar21 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) goto LAB_00167858;
    }
    else if ((uVar21 >> 0x15 & 1) == 0) {
LAB_00167858:
      tab_bar->NextSelectedTabId = id;
    }
  }
  if ((((uVar21 & 2) != 0) && (tab_bar->SelectedTabId != id)) && ((uVar21 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    bVar25 = true;
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar19 < iVar20) && ((tab_bar->Tabs).Size == 1)) {
    bVar25 = (tab_bar->Flags & 2) == 0;
  }
  else {
    bVar25 = false;
  }
  if ((iVar24 < iVar20) && ((ImGuiTabItem *)p_open == (ImGuiTabItem *)0x0 || iVar20 <= iVar19)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return (bool)((uVar21 >> 0x15 & 1) == 0 & bVar25);
  }
  if (tab_bar->SelectedTabId == id) {
    local_38->LastFrameSelected = pIVar7->FrameCount;
  }
  uVar26 = local_38->Flags;
  fVar29 = local_38->Width;
  fVar27 = local_38->Offset;
  if ((uVar26 & 0xc0) == 0) {
    fVar27 = (float)(int)(fVar27 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar27 + (tab_bar->BarRect).Min.x;
  local_40 = (local_80->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar28.y = bb.Min.y;
  IVar28.x = bb.Min.x;
  (local_80->DC).CursorPos = IVar28;
  fVar29 = fVar29 + bb.Min.x;
  fVar27 = (float)local_58._4_4_ + bb.Min.y;
  bb.Max.y = fVar27;
  bb.Max.x = fVar29;
  local_88 = (ImDrawList *)CONCAT44(local_88._4_4_,iVar20);
  if ((uVar26 & 0xc0) == 0) {
    uVar6 = (uint3)(uVar26 >> 8);
    uVar14 = (undefined4)CONCAT71((uint7)uVar6,1);
    if (tab_bar->ScrollingRectMinX <= bb.Min.x) {
      uVar14 = CONCAT31(uVar6,tab_bar->ScrollingRectMaxX <= fVar29 &&
                              fVar29 != tab_bar->ScrollingRectMaxX);
    }
  }
  else {
    uVar14 = 0;
  }
  local_58._0_4_ = uVar14;
  local_5c = iVar24;
  if ((char)uVar14 != '\0') {
    uVar26 = -(uint)(tab_bar->ScrollingRectMinX <= bb.Min.x);
    fStack_74 = bb.Min.y + -1.0;
    _hovered = (float)(~uVar26 & (uint)tab_bar->ScrollingRectMinX | (uint)bb.Min.x & uVar26);
    _held = tab_bar->ScrollingRectMaxX;
    local_8c = fVar27;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
  }
  IVar28 = (pIVar8->DC).CursorMaxPos;
  fStack_74 = bb.Max.y - bb.Min.y;
  _hovered = bb.Max.x - bb.Min.x;
  ItemSize((ImVec2 *)&hovered,(pIVar7->Style).FramePadding.y);
  (pIVar8->DC).CursorMaxPos = IVar28;
  bVar11 = ItemAdd(&bb,id,(ImRect *)0x0);
  if (!bVar11) {
    if (local_58[0] != '\0') {
      PopClipRect();
    }
    (local_80->DC).CursorPos = local_40;
    return bVar25;
  }
  uVar21 = uVar21 & 0x200000;
  bVar11 = ButtonBehavior(&bb,id,&hovered,&held,
                          (uVar21 >> 0x11) + (uint)pIVar7->DragDropActive * 0x200 + 0x1010);
  pIVar23 = local_38;
  if ((bVar11) && (uVar21 == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  hovered = (bool)(hovered | pIVar7->HoveredId == id);
  local_60 = uVar21;
  if (held == false) {
    SetItemAllowOverlap();
  }
  if ((((held == true) && ((int)local_88 <= local_5c)) && (bVar12 = IsMouseDragging(0,-1.0), bVar12)
      ) && ((pIVar7->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) {
    fVar29 = (pIVar7->IO).MouseDelta.x;
    if (fVar29 < 0.0) {
      IVar13 = -1;
      pIVar2 = &(pIVar7->IO).MousePos;
      if (bb.Min.x < pIVar2->x || bb.Min.x == pIVar2->x) goto LAB_00167b51;
LAB_00167b67:
      tab_bar->ReorderRequestTabId = pIVar23->ID;
      tab_bar->ReorderRequestDir = IVar13;
    }
    else {
LAB_00167b51:
      if (0.0 < fVar29) {
        IVar13 = '\x01';
        if (bb.Max.x < (pIVar7->IO).MousePos.x) goto LAB_00167b67;
      }
    }
  }
  pcVar9 = local_68;
  local_88 = local_80->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (bVar25 == false) {
      idx = (uint)((uVar5 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((uVar5 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(local_88,&bb,local_bc,col);
  RenderNavHighlight(&bb,id,1);
  bVar12 = IsItemHovered(8);
  if (bVar12) {
    bVar12 = IsMouseClicked(1,false);
    if (bVar12) {
      uVar21 = local_bc >> 0x15 & 1;
    }
    else {
      bVar12 = IsMouseReleased(1);
      uVar21 = local_60;
      if (!bVar12) goto LAB_00167c69;
    }
    if (uVar21 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_00167c69:
  uVar21 = (uint)tab_bar->Flags >> 1 & 4 | local_bc;
  if (local_70 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  TabItemLabelAndCloseButton
            (local_88,&bb,uVar21,tab_bar->FramePadding,pcVar9,id,close_button_id,bVar25,&just_closed
             ,&text_clipped);
  if ((local_70 != (bool *)0x0) && (just_closed != false)) {
    *local_70 = false;
    if ((pIVar23->Flags & 1) == 0) {
      pIVar23->WantClose = true;
      if (tab_bar->VisibleTabId == pIVar23->ID) {
        pIVar23->LastFrameVisible = -1;
        tab_bar->SelectedTabId = 0;
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else if (tab_bar->VisibleTabId != pIVar23->ID) {
      tab_bar->NextSelectedTabId = pIVar23->ID;
    }
  }
  if (local_58[0] != '\0') {
    PopClipRect();
  }
  (local_80->DC).CursorPos = local_40;
  if ((((text_clipped == true) && (pIVar7->HoveredId == id)) && (held == false)) &&
     (((0.5 < pIVar7->HoveredIdNotActiveTimer && (bVar12 = IsItemHovered(0), bVar12)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((pIVar23->Flags & 0x10) == 0)))))) {
    pcVar18 = FindRenderedTextEnd(pcVar9,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar18 - (int)pcVar9),pcVar9);
  }
  if ((local_bc >> 0x15 & 1) == 0) {
    bVar11 = bVar25;
  }
  return bVar11;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS16)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}